

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::generate_index(t_html_generator *this)

{
  char *pcVar1;
  ostream *poVar2;
  int __oflag;
  int __fd;
  undefined1 local_a0 [8];
  vector<t_program_*,_std::allocator<t_program_*>_> programs;
  string local_80 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string index_fname;
  t_html_generator *this_local;
  
  index_fname.field_2._8_8_ = this;
  std::__cxx11::string::operator=((string *)&this->current_file_,"index.html");
  (*(this->super_t_generator)._vptr_t_generator[0x1b])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&this->current_file_);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,pcVar1,
             (allocator *)
             ((long)&programs.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_out_,(char *)local_80,__oflag);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&programs.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  poVar2 = std::operator<<((ostream *)&this->f_out_,"<!DOCTYPE html>");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"<html lang=\"en\"><head>");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  generate_style_tag(this);
  poVar2 = std::operator<<((ostream *)&this->f_out_,
                           "<title>All Thrift declarations</title></head><body>");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"<div class=\"container-fluid\">");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"<h1>All Thrift declarations</h1>");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&this->f_out_,
                           "<table class=\"table-bordered table-striped table-condensed\"><thead><tr><th>Module</th><th>Services</th><th>Data types</th>"
                          );
  poVar2 = std::operator<<(poVar2,"<th>Constants</th></tr></thead><tbody>");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)local_a0);
  generate_program_toc_rows
            (this,(this->super_t_generator).program_,
             (vector<t_program_*,_std::allocator<t_program_*>_> *)local_a0);
  poVar2 = std::operator<<((ostream *)&this->f_out_,"</tbody></table>");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&this->f_out_,"</div></body></html>");
  __fd = 0x56bc18;
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_out_,__fd);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::~vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)local_a0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void t_html_generator::generate_index() {
  current_file_ = "index.html";
  string index_fname = get_out_dir() + current_file_;
  f_out_.open(index_fname.c_str());
  f_out_ << "<!DOCTYPE html>" << endl << "<html lang=\"en\"><head>" << endl;
  generate_style_tag();
  f_out_ << "<title>All Thrift declarations</title></head><body>" << endl
         << "<div class=\"container-fluid\">" << endl << "<h1>All Thrift declarations</h1>" << endl;
  f_out_ << "<table class=\"table-bordered table-striped "
            "table-condensed\"><thead><tr><th>Module</th><th>Services</th><th>Data types</th>"
         << "<th>Constants</th></tr></thead><tbody>" << endl;
  vector<t_program*> programs;
  generate_program_toc_rows(program_, programs);
  f_out_ << "</tbody></table>" << endl;
  f_out_ << "</div></body></html>" << endl;
  f_out_.close();
}